

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::OnControlChannel(Connection *this)

{
  uint in_stack_000003bc;
  uint8_t *in_stack_000003c0;
  Connection *in_stack_000003c8;
  
  OnControlChannel(in_stack_000003c8,in_stack_000003c0,in_stack_000003bc);
  return;
}

Assistant:

Result Connection::OnControlChannel(const uint8_t* data, unsigned bytes)
{
    const uint8_t controlType = data[0];

    if (controlType == protocol::ControlChannel_S2C_ClientIdAndAddress &&
        bytes >= 1 + 3 + 2)
    {
        Logger.Debug("Remote peer set our client id and address via control channel");

        TONK_DEBUG_ASSERT(!ClientIdAndAddressIsSet);

        /*
            Note that it is currently safe for this event to be received
            multiple times.  If in the future we add more data then it may
            need a flag to check this being set twice.
        */
        const uint32_t id = siamese::ReadU24_LE_Min4Bytes(data + 1);
        const uint16_t port = siamese::ReadU16_LE(data + 1 + 3);

        data += 1 + 3 + 2;
        bytes -= 1 + 3 + 2;

        if (bytes == 4) // IPv4:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 4>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v4(*addrPtr), port));
            return Result::Success();
        }

        if (bytes == 16) // IPv6:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 16>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v6(*addrPtr), port));
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_C2S_NATExternalPort &&
        bytes == protocol::kControlNATExternalBytes)
    {
        const uint16_t port = siamese::ReadU16_LE(data + 1);

        // Peer has announced its NAT-mapped external port
        RemoteNATMapExternalPort = port;

        Logger.Debug("Peer informed its NAT router mapped port ", port);
        return Result::Success();
    }
    else if (controlType == protocol::ControlChannel_S2C_Peer2PeerConnect &&
        bytes >= 1 + protocol::P2PConnectParams::kMinBytes)
    {
        protocol::P2PConnectParams params;
        siamese::ReadByteStream controlStream(data + 1, bytes - 1);
        if (params.Read(controlStream))
        {
            onP2PStartConnect(params);
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_Disconnect &&
        bytes == protocol::kControlDisconnectBytes &&
        data[1] == protocol::ControlChannel_Disconnect &&
        data[2] == protocol::ControlChannel_Disconnect &&
        data[3] == protocol::ControlChannel_Disconnect)
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Disconnected",
                "Connection closed by peer (gracefully)",
                ErrorType::Tonk,
                Tonk_AppRequest));
        return Result::Success();
    }

    // Fall through into invalid data handler:

    TONK_DEBUG_BREAK(); // Invalid data

    std::stringstream ss;
    ss << "Server sent invalid control channel message " << (int)data[0] << " with length " << bytes;
    return Result("Connection::onControlStreamMessage", ss.str(), ErrorType::Tonk, Tonk_InvalidData);
}